

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostAddress_p.cpp
# Opt level: O2

string * __thiscall
BamTools::Internal::HostAddress::GetIPString_abi_cxx11_
          (string *__return_storage_ptr__,HostAddress *this)

{
  ushort uVar1;
  ostream *poVar2;
  uint8_t i;
  long lVar3;
  stringstream ss;
  long local_1a0 [3];
  uint auStack_188 [88];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  if (this->m_protocol == IPv4Protocol) {
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    poVar2 = std::operator<<(poVar2,'.');
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,'.');
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,'.');
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  }
  else if (this->m_protocol == IPv6Protocol) {
    lVar3 = 0;
    do {
      if (lVar3 != 0) {
        if (lVar3 == 8) break;
        std::operator<<((ostream *)local_1a0,':');
      }
      *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
           *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
      uVar1 = *(ushort *)((this->m_ip6Address).data + lVar3 * 2);
      std::ostream::operator<<((ostream *)local_1a0,(uint)(ushort)(uVar1 << 8 | uVar1 >> 8));
      lVar3 = lVar3 + 1;
    } while( true );
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string HostAddress::GetIPString() const
{

    std::stringstream ss;

    // IPv4 format
    if (m_protocol == HostAddress::IPv4Protocol) {
        ss << ((m_ip4Address >> 24) & 0xff) << '.' << ((m_ip4Address >> 16) & 0xff) << '.'
           << ((m_ip4Address >> 8) & 0xff) << '.' << (m_ip4Address & 0xff);

    }

    // IPv6 format
    else if (m_protocol == HostAddress::IPv6Protocol) {
        for (uint8_t i = 0; i < 8; ++i) {
            if (i != 0) ss << ':';
            ss << std::hex
               << ((uint16_t(m_ip6Address[2 * i]) << 8) | (uint16_t(m_ip6Address[2 * i + 1])));
        }
    }

    // return result (empty string if unknown protocol)
    return ss.str();
}